

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::
Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>_>
  *this_00;
  unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  *puVar1;
  _Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
       .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl != (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)0x0) {
    if (((_Var2._M_head_impl)->_capacity != 0) &&
       (Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
        ::memAlive == '\x01')) {
      (_Var2._M_head_impl)->_cursor = (_Var2._M_head_impl)->_stack;
      this_00 = mem();
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
           .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
           _M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
      .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
      _M_head_impl = (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)0x0;
      puVar1 = this_00->_cursor;
      if (puVar1 == this_00->_end) {
        Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>_>
        ::expand(this_00);
        puVar1 = this_00->_cursor;
      }
      (puVar1->_M_t).
      super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
      .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
      _M_head_impl = _Var2._M_head_impl;
      this_00->_cursor = this_00->_cursor + 1;
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
           .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
           _M_head_impl;
      if (_Var2._M_head_impl == (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)0x0)
      goto LAB_00494c55;
    }
    std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>::operator()
              ((default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_> *)this,
               _Var2._M_head_impl);
  }
LAB_00494c55:
  (this->_self)._M_t.
  super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
  .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>._M_head_impl
       = (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)0x0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }